

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> * __thiscall
JsUtil::
BaseDictionary<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Item(BaseDictionary<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *this,ParseNode **key)

{
  Type piVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type this_00;
  uint uVar6;
  
  piVar1 = this->buckets;
  uVar4 = 0;
  if (piVar1 != (Type)0x0) {
    uVar4 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    uVar6 = piVar1[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar6) {
      uVar4 = 0;
      do {
        if (this->entries[uVar6].
            super_DefaultHashedEntry<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>.
            super_ValueEntry<SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>_>
            .
            super_KeyValueEntryDataLayout2<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>
            .key == *key) {
          this_00 = this->stats;
          goto LAB_008276fe;
        }
        uVar4 = uVar4 + 1;
        uVar6 = this->entries[uVar6].
                super_DefaultHashedEntry<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>
                .
                super_ValueEntry<SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                .
                super_KeyValueEntryDataLayout2<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>
                .next;
      } while (-1 < (int)uVar6);
    }
  }
  this_00 = this->stats;
  uVar6 = 0xffffffff;
LAB_008276fe:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  if ((int)uVar6 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0xed,"(i >= 0)","i >= 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return this->entries[(int)uVar6].
         super_DefaultHashedEntry<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>.
         super_ValueEntry<SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>_>
         .
         super_KeyValueEntryDataLayout2<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*>
         .value;
}

Assistant:

TValue Item(const TKey& key)
        {
            int i = FindEntry(key);
            Assert(i >= 0);
            return entries[i].Value();
        }